

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

void reed_solomon_find_error_values(correct_reed_solomon *rs)

{
  polynomial_t der;
  polynomial_t syndromes;
  polynomial_t poly;
  polynomial_t poly_00;
  polynomial_t poly_01;
  polynomial_t locator;
  field_t field;
  field_t field_00;
  field_t field_01;
  field_t field_02;
  field_element_t fVar1;
  int iVar2;
  field_logarithm_t *in_RDI;
  polynomial_t in_stack_00000000;
  uint i;
  polynomial_t syndrome_poly;
  field_element_t *pfVar3;
  undefined8 uVar4;
  undefined8 in_stack_ffffffffffffffc8;
  field_logarithm_t *val_exp;
  undefined7 in_stack_ffffffffffffffd0;
  field_element_t in_stack_ffffffffffffffd7;
  undefined8 in_stack_ffffffffffffffd8;
  field_logarithm_t *pfVar5;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar6;
  field_logarithm_t *pfVar7;
  undefined4 in_stack_fffffffffffffff4;
  
  iVar2 = (int)*(undefined8 *)(in_RDI + 0x10) + -1;
  pfVar7 = *(field_logarithm_t **)(in_RDI + 0x70);
  memset(*(void **)(in_RDI + 0xf0),0,(ulong)(*(int *)(in_RDI + 0xf8) + 1));
  pfVar3 = *(field_element_t **)(in_RDI + 0xf0);
  uVar4 = *(undefined8 *)(in_RDI + 0xf8);
  field_02.log._0_4_ = iVar2;
  field_02.exp = pfVar7;
  field_02.log._4_4_ = in_stack_fffffffffffffff4;
  locator.order = in_stack_ffffffffffffffe0;
  locator.coeff = (field_element_t *)in_stack_ffffffffffffffd8;
  locator._12_4_ = in_stack_ffffffffffffffe4;
  syndromes._8_7_ = in_stack_ffffffffffffffd0;
  syndromes.coeff = (field_element_t *)in_stack_ffffffffffffffc8;
  syndromes._15_1_ = in_stack_ffffffffffffffd7;
  reed_solomon_find_error_evaluator(field_02,locator,syndromes,in_stack_00000000);
  *(int *)(in_RDI + 0x108) = *(int *)(in_RDI + 0x98) + -1;
  field.log._0_4_ = in_stack_ffffffffffffffe0;
  field.exp = (field_element_t *)in_stack_ffffffffffffffd8;
  field.log._4_4_ = in_stack_ffffffffffffffe4;
  poly._8_7_ = in_stack_ffffffffffffffd0;
  poly.coeff = (field_element_t *)in_stack_ffffffffffffffc8;
  poly._15_1_ = in_stack_ffffffffffffffd7;
  der._8_8_ = uVar4;
  der.coeff = pfVar3;
  polynomial_formal_derivative(field,poly,der);
  for (uVar6 = 0; uVar6 < *(uint *)(in_RDI + 0x98); uVar6 = uVar6 + 1) {
    if (*(char *)(*(long *)(in_RDI + 0xc0) + (ulong)uVar6) != '\0') {
      pfVar5 = in_RDI;
      fVar1 = field_pow(*(field_t *)(in_RDI + 0x20),
                        *(field_element_t *)(*(long *)(in_RDI + 0xc0) + (ulong)uVar6),
                        in_RDI[0x18] - 1);
      in_stack_ffffffffffffffe0 = CONCAT13(fVar1,(int3)in_stack_ffffffffffffffe0);
      field_00.exp._4_4_ = uVar6;
      field_00.exp._0_4_ = in_stack_ffffffffffffffe0;
      field_00.log = pfVar7;
      poly_00.coeff._7_1_ = in_stack_ffffffffffffffd7;
      poly_00.coeff._0_7_ = in_stack_ffffffffffffffd0;
      poly_00._8_8_ = pfVar5;
      val_exp = in_RDI;
      in_stack_ffffffffffffffd7 = polynomial_eval_lut(field_00,poly_00,in_RDI);
      field_01.exp._4_4_ = uVar6;
      field_01.exp._0_4_ = in_stack_ffffffffffffffe0;
      field_01.log = pfVar7;
      poly_01.coeff._7_1_ = in_stack_ffffffffffffffd7;
      poly_01.coeff._0_7_ = in_stack_ffffffffffffffd0;
      poly_01._8_8_ = pfVar5;
      fVar1 = polynomial_eval_lut(field_01,poly_01,val_exp);
      fVar1 = field_div(*(field_t *)(val_exp + 0x20),in_stack_ffffffffffffffd7,fVar1);
      fVar1 = field_mul(*(field_t *)(pfVar5 + 0x20),
                        (field_element_t)((uint)in_stack_ffffffffffffffe0 >> 0x18),fVar1);
      *(field_element_t *)(*(long *)(in_RDI + 200) + (ulong)uVar6) = fVar1;
    }
  }
  return;
}

Assistant:

void reed_solomon_find_error_values(correct_reed_solomon *rs) {
    // error value e(j) = -(X(j)^(1-c) * omega(X(j)^-1))/(lambda'(X(j)^-1))
    // where X(j)^-1 is a root of the error locator, omega(X) is the error evaluator,
    //   lambda'(X) is the first formal derivative of the error locator,
    //   and c is the first consecutive root of the generator used in encoding

    // first find omega(X), the error evaluator
    // we generate S(x), the polynomial constructed from the roots of the syndromes
    // this is *not* the polynomial constructed by expanding the products of roots
    // S(x) = S(1) + S(2)*x + ... + S(2t)*x(2t - 1)
    polynomial_t syndrome_poly;
    syndrome_poly.order = rs->min_distance - 1;
    syndrome_poly.coeff = rs->syndromes;
    memset(rs->error_evaluator.coeff, 0, (rs->error_evaluator.order + 1) * sizeof(field_element_t));
    reed_solomon_find_error_evaluator(rs->field, rs->error_locator, syndrome_poly, rs->error_evaluator);

    // now find lambda'(X)
    rs->error_locator_derivative.order = rs->error_locator.order - 1;
    polynomial_formal_derivative(rs->field, rs->error_locator, rs->error_locator_derivative);

    // calculate each e(j)
    for (unsigned int i = 0; i < rs->error_locator.order; i++) {
        if (rs->error_roots[i] == 0) {
            continue;
        }
        rs->error_vals[i] = field_mul(
            rs->field, field_pow(rs->field, rs->error_roots[i], rs->first_consecutive_root - 1),
            field_div(
                rs->field, polynomial_eval_lut(rs->field, rs->error_evaluator, rs->element_exp[rs->error_roots[i]]),
                polynomial_eval_lut(rs->field, rs->error_locator_derivative, rs->element_exp[rs->error_roots[i]])));
    }
}